

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_subexp.h
# Opt level: O3

assignable_ptr_matrix<float> * __thiscall
dlib::assignable_ptr_matrix<float>::operator=
          (assignable_ptr_matrix<float> *this,
          matrix_exp<dlib::matrix_mul_scal_exp<dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>,_false>_>
          *exp)

{
  long lVar1;
  float *pfVar2;
  long lVar3;
  void *pvVar4;
  long lVar5;
  void *local_30;
  long local_28;
  long local_20;
  
  if ((this->ptr == (float *)**(long **)exp) || (this->ptr == *(float **)**(undefined8 **)(exp + 8))
     ) {
    matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>::
    matrix<dlib::matrix_mul_scal_exp<dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>,false>>
              ((matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>
                *)&local_30,exp);
    if (0 < local_28) {
      lVar1 = this->width;
      pfVar2 = this->ptr;
      lVar3 = 0;
      pvVar4 = local_30;
      do {
        if (0 < local_20) {
          lVar5 = 0;
          do {
            pfVar2[lVar5] = *(float *)((long)pvVar4 + lVar5 * 4);
            lVar5 = lVar5 + 1;
          } while (local_20 != lVar5);
        }
        lVar3 = lVar3 + 1;
        pfVar2 = pfVar2 + lVar1;
        pvVar4 = (void *)((long)pvVar4 + local_20 * 4);
      } while (lVar3 != local_28);
    }
    if (local_30 != (void *)0x0) {
      operator_delete__(local_30);
    }
  }
  else {
    blas_bindings::
    matrix_assign_blas<float,dlib::matrix_mul_scal_exp<dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>,false>>
              (this,(matrix_mul_scal_exp<dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>,_false>
                     *)exp);
  }
  return this;
}

Assistant:

assignable_ptr_matrix& operator= (
            const matrix_exp<EXP>& exp
        ) 
        {
            // You can only assign to a set_ptrm() expression with a source matrix that
            // contains the same type of elements as the target (i.e. you can't mix double
            // and float types).
            COMPILE_TIME_ASSERT((is_same_type<T, typename EXP::type>::value == true));

            DLIB_ASSERT( exp.nr() == height && exp.nc() == width,
                "\tassignable_matrix_expression set_ptrm()"
                << "\n\tYou have tried to assign to this object using a matrix that isn't the right size"
                << "\n\texp.nr() (source matrix): " << exp.nr()
                << "\n\texp.nc() (source matrix): " << exp.nc() 
                << "\n\twidth (target matrix):    " << width
                << "\n\theight (target matrix):   " << height
                );

            if (exp.destructively_aliases(mat(ptr,height,width)) == false)
            {
                matrix_assign(*this, exp); 
            }
            else
            {
                // make a temporary copy of the matrix we are going to assign to ptr to 
                // avoid aliasing issues during the copy
                this->operator=(tmp(exp));
            }

            return *this;
        }